

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O3

void __thiscall
checkqueue_tests::test_CheckQueue_Catches_Failure::test_method
          (test_CheckQueue_Catches_Failure *this)

{
  ulong uVar1;
  readonly_property<bool> rVar2;
  CCheckQueue<FakeCheckCheckCompletion> *this_00;
  uint64_t __n;
  iterator in_R8;
  iterator in_R9;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  __single_object fail_queue;
  CCheckQueueControl<FailingCheck> control;
  check_type cVar5;
  check_type cVar6;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 local_a8 [8];
  FailingCheck *pFStack_a0;
  FailingCheck *local_98;
  char **local_90;
  assertion_result local_88;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  _Head_base<0UL,_CCheckQueue<FailingCheck>_*,_false> local_50;
  CCheckQueueControl<FailingCheck> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CCheckQueue<FakeCheckCheckCompletion> *)operator_new(0x100);
  CCheckQueue<FailingCheck>::CCheckQueue((CCheckQueue<FailingCheck> *)this_00,0x80,3);
  _cVar5 = CHECK_PRED;
  local_50._M_head_impl = this_00;
  do {
    CCheckQueueControl<FailingCheck>::CCheckQueueControl(&local_48,local_50._M_head_impl);
    _cVar6 = _cVar5;
    while (_cVar5 != CHECK_PRED) {
      do {
        __n = RandomMixin<FastRandomContext>::randbits
                        (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_NoLockLoggingTestingSetup
                          .super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                          super_RandomMixin<FastRandomContext>,4);
      } while (9 < __n);
      local_a8 = (undefined1  [8])0x0;
      pFStack_a0 = (FailingCheck *)0x0;
      local_98 = (FailingCheck *)0x0;
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::reserve
                ((vector<FailingCheck,_std::allocator<FailingCheck>_> *)local_a8,__n);
      if (__n != 0) {
        uVar3 = 0;
        do {
          local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)((long)_cVar5 - 1 == uVar3);
          if (pFStack_a0 == local_98) {
            std::vector<FailingCheck,_std::allocator<FailingCheck>_>::_M_realloc_insert<bool>
                      ((vector<FailingCheck,_std::allocator<FailingCheck>_> *)local_a8,
                       (iterator)pFStack_a0,(bool *)&local_88);
          }
          else {
            pFStack_a0->fails =
                 (bool)local_88.p_predicate_value.super_readonly_property<bool>.
                       super_class_property<bool>.value;
            pFStack_a0 = pFStack_a0 + 1;
          }
          uVar1 = uVar3 + 1;
        } while ((uVar1 < __n) && (bVar4 = (long)_cVar5 - 1 != uVar3, uVar3 = uVar1, bVar4));
        _cVar5 = (check_type)((long)_cVar5 - uVar1);
      }
      if (local_48.pqueue != (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
        CCheckQueue<FailingCheck>::Add
                  ((CCheckQueue<FailingCheck> *)local_48.pqueue,
                   (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                   local_a8);
      }
      if (local_a8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_a8,(long)local_98 - (long)local_a8);
      }
    }
    if (local_48.pqueue == (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
      rVar2.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      rVar2.super_class_property<bool>.value =
           (class_property<bool>)
           CCheckQueue<FailingCheck>::Loop((CCheckQueue<FailingCheck> *)local_48.pqueue,true);
      local_48.fDone = true;
    }
    if (_cVar6 == CHECK_PRED) {
      local_d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_d0 = "";
      local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xf0;
      file_00.m_begin = (iterator)&local_d8;
      msg_00.m_end = in_R9;
      msg_00.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,
                 msg_00);
      local_88.m_message.px = (element_type *)0x0;
      local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b8 = "success";
      local_b0 = "";
      pFStack_a0 = (FailingCheck *)((ulong)pFStack_a0 & 0xffffffffffffff00);
      local_a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
      local_98 = (FailingCheck *)boost::unit_test::lazy_ostream::inst;
      local_90 = &local_b8;
      local_f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_f0 = "";
      in_R8 = (iterator)0x2;
      in_R9 = (iterator)0x0;
      local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                (&local_88,(lazy_ostream *)local_a8,2,0,WARN,_cVar6,(size_t)&local_f8,0xf0);
    }
    else {
      local_60 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_58 = "";
      local_70 = &boost::unit_test::basic_cstring<char_const>::null;
      local_68 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0xee;
      file.m_begin = (iterator)&local_60;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_70,msg);
      local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)((byte)rVar2.super_class_property<bool>.value ^ 1);
      local_88.m_message.px = (element_type *)0x0;
      local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_b8 = "!success";
      local_b0 = "";
      pFStack_a0 = (FailingCheck *)((ulong)pFStack_a0 & 0xffffffffffffff00);
      local_a8 = (undefined1  [8])&PTR__lazy_ostream_01389048;
      local_98 = (FailingCheck *)boost::unit_test::lazy_ostream::inst;
      local_90 = &local_b8;
      local_c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_c0 = "";
      in_R8 = (iterator)0x2;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_88,(lazy_ostream *)local_a8,2,0,WARN,_cVar6,(size_t)&local_c8,0xee);
    }
    boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
    CCheckQueueControl<FailingCheck>::~CCheckQueueControl(&local_48);
    _cVar5 = (check_type)((long)_cVar6 + 1);
  } while (_cVar5 != 0x3e9);
  std::unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>::
  ~unique_ptr((unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>
               *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Catches_Failure)
{
    auto fail_queue = std::make_unique<Failing_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    for (size_t i = 0; i < 1001; ++i) {
        CCheckQueueControl<FailingCheck> control(fail_queue.get());
        size_t remaining = i;
        while (remaining) {
            size_t r = m_rng.randrange(10);

            std::vector<FailingCheck> vChecks;
            vChecks.reserve(r);
            for (size_t k = 0; k < r && remaining; k++, remaining--)
                vChecks.emplace_back(remaining == 1);
            control.Add(std::move(vChecks));
        }
        bool success = control.Wait();
        if (i > 0) {
            BOOST_REQUIRE(!success);
        } else if (i == 0) {
            BOOST_REQUIRE(success);
        }
    }
}